

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O1

MPP_RET process_sps(H264_SLICE_t *currSlice)

{
  h264d_cur_ctx_t *cur_sps;
  MPP_RET MVar1;
  h264_sps_t *phVar2;
  undefined8 uVar3;
  
  cur_sps = currSlice->p_Cur;
  memset(cur_sps,0,0x102c);
  MVar1 = parser_sps(&cur_sps->bitctx,&cur_sps->sps,currSlice->p_Dec);
  if (MVar1 < MPP_OK) {
    if (((byte)h264d_debug & 4) == 0) {
      return MVar1;
    }
    uVar3 = 0x1d4;
  }
  else {
    MVar1 = get_max_dec_frame_buf_size(&cur_sps->sps);
    if (MPP_NOK < MVar1) {
      if ((cur_sps->sps).Valid != 0) {
        if (currSlice->p_Vid->spsSet[(cur_sps->sps).seq_parameter_set_id] == (h264_sps_t *)0x0) {
          phVar2 = (h264_sps_t *)mpp_osal_calloc("process_sps",0x102c);
          currSlice->p_Vid->spsSet[(cur_sps->sps).seq_parameter_set_id] = phVar2;
        }
        memcpy(currSlice->p_Vid->spsSet[(cur_sps->sps).seq_parameter_set_id],cur_sps,0x102c);
      }
      cur_sps->p_Vid->spspps_update = 1;
      return MPP_OK;
    }
    if (((byte)h264d_debug & 4) == 0) {
      return MVar1;
    }
    uVar3 = 0x1d6;
  }
  _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,uVar3);
  return MVar1;
}

Assistant:

MPP_RET process_sps(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    H264_SPS_t *cur_sps = &p_Cur->sps;

    reset_cur_sps_data(cur_sps); // reset
    //!< parse sps
    FUN_CHECK(ret = parser_sps(p_bitctx, cur_sps, currSlice->p_Dec));
    //!< decide "max_dec_frame_buffering" for DPB
    FUN_CHECK(ret = get_max_dec_frame_buf_size(cur_sps));
    //!< make SPS available, copy
    if (cur_sps->Valid) {
        if (!currSlice->p_Vid->spsSet[cur_sps->seq_parameter_set_id]) {
            currSlice->p_Vid->spsSet[cur_sps->seq_parameter_set_id] = mpp_calloc(H264_SPS_t, 1);
        }
        memcpy(currSlice->p_Vid->spsSet[cur_sps->seq_parameter_set_id],
               cur_sps, sizeof(H264_SPS_t));
    }
    p_Cur->p_Vid->spspps_update = 1;

    return ret = MPP_OK;
__FAILED:
    return ret;
}